

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O0

void capnp::_::PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::set
               (PointerBuilder builder,Reader *value)

{
  bool bVar1;
  Fault local_80;
  Fault f;
  Reader local_48;
  bool local_12;
  DebugExpression<bool> local_11;
  Reader *pRStack_10;
  DebugExpression<bool> _kjCondition;
  Reader *value_local;
  
  pRStack_10 = value;
  Schema::getProto((Reader *)&f,(Schema *)value);
  capnp::schema::Node::Reader::getStruct(&local_48,(Reader *)&f);
  bVar1 = capnp::schema::Node::Struct::Reader::getIsGroup(&local_48);
  local_12 = (bool)((bVar1 ^ 0xffU) & 1);
  local_11 = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_12);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_11);
  if (!bVar1) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[35]>
              (&local_80,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x77d,FAILED,"!value.schema.getProto().getStruct().getIsGroup()",
               "_kjCondition,\"Cannot form pointer to group type.\"",&local_11,
               (char (*) [35])"Cannot form pointer to group type.");
    kj::_::Debug::Fault::fatal(&local_80);
  }
  PointerBuilder::setStruct(&builder,&pRStack_10->reader,false);
  return;
}

Assistant:

void PointerHelpers<DynamicStruct, Kind::OTHER>::set(
    PointerBuilder builder, const DynamicStruct::Reader& value) {
  KJ_REQUIRE(!value.schema.getProto().getStruct().getIsGroup(),
             "Cannot form pointer to group type.");
  builder.setStruct(value.reader);
}